

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O2

void pstore::exchange::export_ns::emit_compilation
               (ostream_base *os,indent ind,database *db,compilation *compilation,
               string_mapping *strings,bool comments)

{
  uint uVar1;
  uint128 d;
  indent iVar2;
  ostream_base *poVar3;
  char *pcVar4;
  typed_address<pstore::indirect_string> *ptVar5;
  compilation *__n;
  size_t __n_00;
  int __c;
  int __c_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX;
  void *pvVar6;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_11;
  void *extraout_RDX_02;
  void *__buf_12;
  void *__buf_13;
  long lVar7;
  int __fd;
  undefined3 in_register_00000089;
  undefined8 uStack_78;
  indent ind_local;
  indent local_68;
  indent local_64;
  database *local_60;
  maybe<pstore::typed_address<pstore::indirect_string>,_void> prev_name;
  typed_address<pstore::indirect_string> local_40;
  indent object_indent;
  
  __n = compilation;
  ind_local = ind;
  ostream_base::write(os,0x123988,db,(size_t)compilation);
  object_indent.distance_ = ind.distance_ + 1;
  poVar3 = operator<<(os,&object_indent);
  poVar3 = (ostream_base *)ostream_base::write(poVar3,0x124827,__buf,(size_t)__n);
  pcVar4 = string_mapping::index(strings,(char *)(compilation->triple_).a_.a_,__c);
  poVar3 = ostream_base::write<unsigned_long,void>(poVar3,(unsigned_long)pcVar4);
  ostream_base::write(poVar3,0x2c,__buf_00,(size_t)__n);
  __n_00 = (size_t)CONCAT31(in_register_00000089,comments);
  local_60 = db;
  show_string(os,db,(typed_address<pstore::indirect_string>)(compilation->triple_).a_.a_,comments);
  poVar3 = (ostream_base *)ostream_base::write(os,10,__buf_01,__n_00);
  poVar3 = operator<<(poVar3,&object_indent);
  ostream_base::write(poVar3,0x124831,__buf_02,__n_00);
  iVar2 = object_indent;
  uVar1 = compilation->size_;
  local_64.distance_ = object_indent.distance_;
  ostream_base::write(os,0x123de2,__buf_03,__n_00);
  prev_name.valid_ = false;
  local_68.distance_ = iVar2.distance_ + 1;
  __fd = 0x1230ef;
  pvVar6 = extraout_RDX;
  for (lVar7 = 0; (ulong)uVar1 * 0x30 - lVar7 != 0; lVar7 = lVar7 + 0x30) {
    ostream_base::write(os,__fd,pvVar6,__n_00);
    if (prev_name.valid_ == true) {
      ptVar5 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->(&prev_name);
      __n_00 = (size_t)(uint)comments;
      show_string(os,local_60,(typed_address<pstore::indirect_string>)(ptVar5->a_).a_,comments);
      ostream_base::write(os,10,__buf_04,__n_00);
    }
    operator<<(os,&local_68);
    ostream_base::write(os,0x124840,__buf_05,__n_00);
    d.v_._8_1_ = comments;
    d.v_._0_8_ = uStack_78;
    d.v_._9_3_ = 0;
    d.v_._12_4_ = ind_local.distance_;
    emit_digest((export_ns *)os,*(ostream_base **)((long)(&compilation->signature_ + 4) + lVar7),d);
    poVar3 = (ostream_base *)ostream_base::write(os,0x12484b,__buf_06,__n_00);
    pcVar4 = string_mapping::index
                       (strings,*(char **)((long)(&compilation->signature_ + 8) + lVar7),__c_00);
    poVar3 = ostream_base::write<unsigned_long,void>(poVar3,(unsigned_long)pcVar4);
    poVar3 = (ostream_base *)ostream_base::write(poVar3,0x124854,__buf_07,__n_00);
    poVar3 = repo::operator<<(poVar3,*(linkage *)((long)(&compilation->signature_ + 9) + lVar7) &
                                     (weak_odr|weak_any));
    ostream_base::write(poVar3,0x22,__buf_08,__n_00);
    pvVar6 = __buf_09;
    if ((*(byte *)((long)(&compilation->signature_ + 9) + lVar7) & 0x30) != 0) {
      poVar3 = (ostream_base *)ostream_base::write(os,0x124861,__buf_09,__n_00);
      poVar3 = repo::operator<<(poVar3,*(byte *)((long)(&compilation->signature_ + 9) + lVar7) >> 4
                                       & (protected_vis|hidden_vis));
      ostream_base::write(poVar3,0x22,__buf_10,__n_00);
      pvVar6 = extraout_RDX_00;
    }
    ostream_base::write(os,0x7d,pvVar6,__n_00);
    local_40.a_.a_ = *(address *)((long)(&compilation->signature_ + 8) + lVar7);
    maybe<pstore::typed_address<pstore::indirect_string>,void>::operator=
              ((maybe<pstore::typed_address<pstore::indirect_string>,void> *)&prev_name,&local_40);
    __fd = 0x123996;
    pvVar6 = extraout_RDX_01;
  }
  if (prev_name.valid_ == true) {
    ptVar5 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->(&prev_name);
    __n_00 = (size_t)(uint)comments;
    show_string(os,local_60,(typed_address<pstore::indirect_string>)(ptVar5->a_).a_,comments);
    poVar3 = (ostream_base *)ostream_base::write(os,10,__buf_11,__n_00);
    operator<<(poVar3,&local_64);
    pvVar6 = extraout_RDX_02;
  }
  ostream_base::write(os,0x5d,pvVar6,__n_00);
  poVar3 = (ostream_base *)ostream_base::write(os,10,__buf_12,__n_00);
  poVar3 = operator<<(poVar3,&ind_local);
  ostream_base::write(poVar3,0x7d,__buf_13,__n_00);
  return;
}

Assistant:

void emit_compilation (ostream_base & os, indent const ind, database const & db,
                                   repo::compilation const & compilation,
                                   string_mapping const & strings, bool const comments) {
                os << "{\n";
                auto const object_indent = ind.next ();
                os << object_indent << R"("triple":)" << strings.index (compilation.triple ())
                   << ',';
                show_string (os, db, compilation.triple (), comments);
                os << '\n' << object_indent << R"("definitions":)";
                emit_array_with_name (os, object_indent, db, compilation.begin (),
                                      compilation.end (), comments,
                                      [&] (ostream_base & os1, repo::definition const & d) {
                                          os1 << R"({"digest":)";
                                          emit_digest (os1, d.digest);
                                          os1 << R"(,"name":)" << strings.index (d.name)
                                              << R"(,"linkage":")" << d.linkage () << '"';
                                          if (d.visibility () != repo::visibility::default_vis) {
                                              os1 << R"(,"visibility":")" << d.visibility () << '"';
                                          }
                                          os1 << '}';
                                          return d.name;
                                      });
                os << '\n' << ind << '}';
            }